

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void ns_call(ns_connection *nc,int ev,void *p)

{
  ulong uVar1;
  FILE *__stream;
  time_t tVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  int len;
  char local_b8 [64];
  char src [60];
  
  pcVar6 = nc->mgr->hexdump_file;
  if (ev != 0 && pcVar6 != (char *)0x0) {
    uVar3 = 0;
    if (ev - 3U < 2) {
      uVar3 = (ulong)*p;
    }
    lVar4 = 0x38;
    if (ev == 4) {
      lVar4 = 0x50;
    }
    __stream = fopen64(pcVar6,"a");
    if (__stream != (FILE *)0x0) {
      ns_sock_to_str(nc->sock,src,0x3c,3);
      ns_sock_to_str(nc->sock,local_b8,0x3c,7);
      tVar2 = time((time_t *)0x0);
      pcVar6 = "->";
      if (ev == 3) {
        pcVar6 = "<-";
      }
      if (1 < ev - 3U) {
        if (ev == 1) {
          pcVar6 = "<A";
        }
        else {
          pcVar6 = "XX";
          if (ev == 2) {
            pcVar6 = "C>";
          }
        }
      }
      fprintf(__stream,"%lu %p %s %s %s %d\n",tVar2,nc->user_data,src,pcVar6,local_b8,uVar3);
      len = (int)uVar3;
      if (0 < len) {
        uVar1 = uVar3 * 5 + 100;
        pcVar6 = (char *)malloc(uVar1 & 0xffffffff);
        if (pcVar6 != (char *)0x0) {
          if (ev == 4) {
            uVar3 = 0;
            lVar5 = 0;
          }
          else {
            lVar5 = *(long *)((long)&nc->prev + lVar4);
          }
          ns_hexdump((void *)((*(long *)((long)&nc->next + lVar4) + lVar5) - uVar3),len,pcVar6,
                     (int)uVar1);
          fputs(pcVar6,__stream);
          free(pcVar6);
        }
      }
      fclose(__stream);
    }
  }
  (*nc->callback)(nc,ev,p);
  return;
}

Assistant:

static void ns_call(struct ns_connection *nc, int ev, void *p) {
  if (nc->mgr->hexdump_file != NULL && ev != NS_POLL) {
    int len = (ev == NS_RECV || ev == NS_SEND) ? * (int *) p : 0;
    hexdump(nc, nc->mgr->hexdump_file, len, ev);
  }

  nc->callback(nc, ev, p);
}